

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O1

void __thiscall Js::PolymorphicInlineCache::Dump(PolymorphicInlineCache *this)

{
  ulong uVar1;
  long lVar2;
  
  if (this->size != 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      if (*(long *)((long)&this->inlineCaches->u + lVar2) != 0) {
        Output::Print(L"  %d: ",uVar1 & 0xffffffff);
        InlineCache::Dump((InlineCache *)((long)&this->inlineCaches->u + lVar2));
        Output::Print(L"\n");
      }
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x20;
    } while (uVar1 < this->size);
  }
  return;
}

Assistant:

void PolymorphicInlineCache::Dump()
    {
        for (uint i = 0; i < size; ++i)
        {
            if (!inlineCaches[i].IsEmpty())
            {
                Output::Print(_u("  %d: "), i);
                inlineCaches[i].Dump();
                Output::Print(_u("\n"));
            }
        }
    }